

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O1

QByteArray * getEtcFileContent(QByteArray *__return_storage_ptr__,char *filename)

{
  Data *pDVar1;
  char *__buf;
  int __fd;
  int iVar2;
  int *piVar3;
  ssize_t size;
  long in_FS_OFFSET;
  stat64 sbuf;
  stat64 local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    __fd = open64(filename,0x80000,0x1ff);
    if (__fd != -1) {
      memset(&local_c0,0xaa,0x90);
      iVar2 = fstat64(__fd,&local_c0);
      if (iVar2 == -1) goto LAB_00219e67;
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(__return_storage_ptr__,local_c0.st_size,Uninitialized);
      pDVar1 = (__return_storage_ptr__->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
      }
      __buf = (__return_storage_ptr__->d).ptr;
      goto LAB_00219e04;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  goto LAB_00219e73;
  while (piVar3 = __errno_location(), *piVar3 == 4) {
LAB_00219e04:
    size = read(__fd,__buf,local_c0.st_size);
    if (size != -1) break;
  }
  QByteArray::resize(__return_storage_ptr__,size);
  do {
    iVar2 = close(__fd);
    if (iVar2 != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  goto LAB_00219edd;
  while (piVar3 = __errno_location(), *piVar3 == 4) {
LAB_00219e67:
    iVar2 = close(__fd);
    if (iVar2 != -1) break;
  }
LAB_00219e73:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_00219edd:
  __stack_chk_fail();
}

Assistant:

static QByteArray getEtcFileContent(const char *filename)
{
    // we're avoiding QFile here
    int fd = qt_safe_open(filename, O_RDONLY);
    if (fd == -1)
        return QByteArray();

    QT_STATBUF sbuf;
    if (QT_FSTAT(fd, &sbuf) == -1) {
        qt_safe_close(fd);
        return QByteArray();
    }

    QByteArray buffer(sbuf.st_size, Qt::Uninitialized);
    buffer.resize(qt_safe_read(fd, buffer.data(), sbuf.st_size));
    qt_safe_close(fd);
    return buffer;
}